

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O3

writer * argo::operator<<(writer *w,double d)

{
  ostringstream ss;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0x11;
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(d);
  std::__cxx11::stringbuf::str();
  (*w->_vptr_writer[2])(w,local_1a8);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return w;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, double d)
{
    ostringstream ss;
    ss << setprecision(17) << fixed << d;
    w.write(ss.str());
    return w;
}